

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

QRect __thiscall
QAbstractItemViewPrivate::intersectedRect
          (QAbstractItemViewPrivate *this,QRect rect,QModelIndex *topLeft,QModelIndex *bottomRight)

{
  long *plVar1;
  int iVar2;
  int iVar3;
  long in_FS_OFFSET;
  QRect QVar4;
  undefined1 local_a0 [24];
  QRect local_88;
  QRect local_78;
  QModelIndex local_68;
  QRect local_48;
  long local_38;
  
  local_48._8_8_ = rect._8_8_;
  local_48._0_8_ = rect._0_8_;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)&(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                      super_QWidgetPrivate.field_0x8;
  local_68.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::parent(&local_68,topLeft);
  local_78.x1.m_i = 0;
  local_78.y1.m_i = 0;
  local_78.x2.m_i = -1;
  local_78.y2.m_i = -1;
  for (iVar3 = topLeft->r; iVar3 <= bottomRight->r; iVar3 = iVar3 + 1) {
    for (iVar2 = topLeft->c; iVar2 <= bottomRight->c; iVar2 = iVar2 + 1) {
      (**(code **)(*(long *)this->model + 0x60))(local_a0,this->model,iVar3,iVar2,&local_68);
      QVar4 = (QRect)(**(code **)(*plVar1 + 0x1e0))(plVar1,local_a0);
      local_88 = QVar4;
      QRect::operator|=(&local_78,&local_88);
    }
  }
  QVar4 = (QRect)QRect::operator&(&local_48,&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

QRect QAbstractItemViewPrivate::intersectedRect(const QRect rect, const QModelIndex &topLeft, const QModelIndex &bottomRight) const
{
    Q_Q(const QAbstractItemView);

    const auto parentIdx = topLeft.parent();
    QRect updateRect;
    for (int r = topLeft.row(); r <= bottomRight.row(); ++r) {
        for (int c = topLeft.column(); c <= bottomRight.column(); ++c)
            updateRect |= q->visualRect(model->index(r, c, parentIdx));
    }
    return rect.intersected(updateRect);
}